

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Computations.h
# Opt level: O0

box SIVIA_dyn(box *P0,deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                      *d_all_mes_vector,deque<double,_std::allocator<double>_> *alpha_mes_vector,
             deque<double,_std::allocator<double>_> *t_history_vector,
             deque<interval,_std::allocator<interval>_> *xhat_history_vector,
             deque<interval,_std::allocator<interval>_> *yhat_history_vector,
             deque<interval,_std::allocator<interval>_> *psihat_history_vector,
             deque<interval,_std::allocator<interval>_> *vrxhat_history_vector,double *d_max_err,
             double *alpha_max_err,int *sdir,interval *alphashat,
             vector<double,_std::allocator<double>_> *walls_xa,
             vector<double,_std::allocator<double>_> *walls_ya,
             vector<double,_std::allocator<double>_> *walls_xb,
             vector<double,_std::allocator<double>_> *walls_yb,
             vector<double,_std::allocator<double>_> *circles_x,
             vector<double,_std::allocator<double>_> *circles_y,
             vector<double,_std::allocator<double>_> *circles_r)

{
  bool bVar1;
  reference X;
  undefined8 extraout_RDX;
  box bVar2;
  vector<double,_std::allocator<double>_> *in_stack_00000070;
  vector<box,_std::allocator<box>_> local_e0;
  undefined1 local_c8 [4];
  int nb_bisections;
  box P2;
  box P1;
  undefined1 local_90 [8];
  vector<box,_std::allocator<box>_> Result;
  list<box,_std::allocator<box>_> L;
  deque<interval,_std::allocator<interval>_> *xhat_history_vector_local;
  deque<double,_std::allocator<double>_> *t_history_vector_local;
  deque<double,_std::allocator<double>_> *alpha_mes_vector_local;
  deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
  *d_all_mes_vector_local;
  box *P0_local;
  box *P;
  
  std::__cxx11::list<box,_std::allocator<box>_>::list
            ((list<box,_std::allocator<box>_> *)
             &Result.super__Vector_base<box,_std::allocator<box>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  std::vector<box,_std::allocator<box>_>::vector((vector<box,_std::allocator<box>_> *)local_90);
  box::box(P0);
  box::box((box *)&P2.dim);
  box::box((box *)local_c8);
  local_e0.super__Vector_base<box,_std::allocator<box>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  std::__cxx11::list<box,_std::allocator<box>_>::push_back
            ((list<box,_std::allocator<box>_> *)
             &Result.super__Vector_base<box,_std::allocator<box>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(value_type *)d_all_mes_vector);
  while (bVar1 = std::__cxx11::list<box,_std::allocator<box>_>::empty
                           ((list<box,_std::allocator<box>_> *)
                            &Result.super__Vector_base<box,_std::allocator<box>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage), ((bVar1 ^ 0xffU) & 1) != 0)
  {
    X = std::__cxx11::list<box,_std::allocator<box>_>::front
                  ((list<box,_std::allocator<box>_> *)
                   &Result.super__Vector_base<box,_std::allocator<box>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    box::operator=(P0,X);
    std::__cxx11::list<box,_std::allocator<box>_>::pop_front
              ((list<box,_std::allocator<box>_> *)
               &Result.super__Vector_base<box,_std::allocator<box>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage);
    Contract_dyn(P0,(deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
                     *)alpha_mes_vector,t_history_vector,
                 (deque<double,_std::allocator<double>_> *)xhat_history_vector,yhat_history_vector,
                 psihat_history_vector,vrxhat_history_vector,
                 (deque<interval,_std::allocator<interval>_> *)d_max_err,alpha_max_err,
                 (double *)sdir,(int *)alphashat,(interval *)walls_xa,walls_ya,walls_xb,walls_yb,
                 circles_x,circles_y,circles_r,in_stack_00000070);
    bVar1 = box::IsEmpty(P0);
    if (!bVar1) {
      if (local_e0.super__Vector_base<box,_std::allocator<box>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage._4_4_ < 0xb) {
        Bisect(P0,(box *)&P2.dim,(box *)local_c8);
        std::__cxx11::list<box,_std::allocator<box>_>::push_back
                  ((list<box,_std::allocator<box>_> *)
                   &Result.super__Vector_base<box,_std::allocator<box>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(value_type *)&P2.dim);
        std::__cxx11::list<box,_std::allocator<box>_>::push_back
                  ((list<box,_std::allocator<box>_> *)
                   &Result.super__Vector_base<box,_std::allocator<box>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,(value_type *)local_c8);
        local_e0.super__Vector_base<box,_std::allocator<box>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ =
             local_e0.super__Vector_base<box,_std::allocator<box>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage._4_4_ + 1;
      }
      else {
        std::vector<box,_std::allocator<box>_>::push_back
                  ((vector<box,_std::allocator<box>_> *)local_90,P0);
      }
    }
  }
  Union(&local_e0);
  box::operator=(P0,(box *)&local_e0);
  box::~box((box *)&local_e0);
  box::~box((box *)local_c8);
  box::~box((box *)&P2.dim);
  std::vector<box,_std::allocator<box>_>::~vector((vector<box,_std::allocator<box>_> *)local_90);
  std::__cxx11::list<box,_std::allocator<box>_>::~list
            ((list<box,_std::allocator<box>_> *)
             &Result.super__Vector_base<box,_std::allocator<box>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  bVar2._8_8_ = extraout_RDX;
  bVar2.data = (interval *)P0;
  return bVar2;
}

Assistant:

inline box SIVIA_dyn(box P0, deque< vector<interval> >& d_all_mes_vector, deque<double>& alpha_mes_vector, 
						 deque<double>& t_history_vector, deque<interval>& xhat_history_vector, deque<interval>& yhat_history_vector, 
						 deque<interval>& psihat_history_vector, deque<interval>& vrxhat_history_vector, 
						 double& d_max_err, double& alpha_max_err, int& sdir, interval& alphashat, 
						 vector<double>& walls_xa, vector<double>& walls_ya, vector<double>& walls_xb, vector<double>& walls_yb, 
						 vector<double>& circles_x, vector<double>& circles_y, vector<double>& circles_r)
{   
	list<box> L;
	vector<box> Result;
	box P, P1, P2;
	int nb_bisections = 0;

	L.push_back(P0);
	while (!L.empty())
	{ 
		P = L.front();
		L.pop_front();

		Contract_dyn(P, d_all_mes_vector, alpha_mes_vector, 
			t_history_vector, xhat_history_vector, yhat_history_vector, 
			psihat_history_vector, vrxhat_history_vector,
			d_max_err, alpha_max_err, sdir, alphashat, 
			walls_xa, walls_ya, walls_xb, walls_yb, 
			circles_x, circles_y, circles_r);

		if (!P.IsEmpty())
		{  
			//if (P.Width() < 0.1)
			if (nb_bisections > 10)
			{

				/*				//
				COORDSYSTEM2IMG csMap2FullImg;

				InitCS2ImgEx(&csMap2FullImg, &csMap, imgwidth, imgheight, BEST_RATIO_COORDSYSTEM2IMG);

				cvRectangle(img, 
				cvPoint(
				XCS2JImg(&csMap2FullImg, Center(P[1])-0.5*Width(P[1])), 
				YCS2IImg(&csMap2FullImg, Center(P[2])-0.5*Width(P[2]))), 
				cvPoint(
				XCS2JImg(&csMap2FullImg, Center(P[1])+0.5*Width(P[1])), 
				YCS2IImg(&csMap2FullImg, Center(P[2])+0.5*Width(P[2]))), 
				CV_RGB_CvScalar(0, 128, 128), CV_FILLED, 8, 0);
				cvRectangle(img, 
				cvPoint(
				XCS2JImg(&csMap2FullImg, Center(P[1])-0.5*Width(P[1])), 
				YCS2IImg(&csMap2FullImg, Center(P[2])-0.5*Width(P[2]))), 
				cvPoint(
				XCS2JImg(&csMap2FullImg, Center(P[1])+0.5*Width(P[1])), 
				YCS2IImg(&csMap2FullImg, Center(P[2])+0.5*Width(P[2]))), 
				CV_RGB_CvScalar(0, 255, 255), 1, 8, 0);
				*/				//

				Result.push_back(P);
			}
			else  
			{   
				Bisect(P, P1, P2);
				L.push_back(P1);
				L.push_back(P2);
				nb_bisections++;
			}
		}
	}

	P = Union(Result);
	//printf("nb_bisections = %d\n", nb_bisections);

	return P;
}